

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_route.c
# Opt level: O0

int csp_route_work(void)

{
  csp_id_t_conflict idout_00;
  undefined1 uVar1;
  undefined1 uVar2;
  _Bool _Var3;
  int iVar4;
  csp_iface_t *pcVar5;
  csp_id_t_conflict idin;
  csp_socket_t *pcVar6;
  csp_conn_t *pcVar7;
  csp_conn_t *unaff_retaddr;
  _Bool close_connection;
  csp_id_t_conflict idout;
  csp_callback_t callback;
  int is_to_me;
  csp_socket_t *socket;
  csp_conn_t *conn;
  csp_packet_t *packet;
  csp_qfifo_t input;
  csp_conn_t *in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffb0;
  uint16_t in_stack_ffffffffffffffb2;
  undefined2 in_stack_ffffffffffffffb4;
  bool bVar8;
  undefined1 uVar9;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffb9;
  undefined2 in_stack_ffffffffffffffba;
  undefined2 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  csp_iface_t *in_stack_ffffffffffffffd0;
  csp_packet_t *in_stack_ffffffffffffffd8;
  csp_iface_t *in_stack_ffffffffffffffe8;
  csp_packet_t *local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  csp_conn_check_timeouts();
  iVar4 = csp_qfifo_read((csp_qfifo_t *)in_stack_ffffffffffffffa8);
  if (iVar4 == 0) {
    if (local_10 == (csp_packet_t *)0x0) {
      iVar4 = -3;
    }
    else {
      csp_input_hook(in_stack_ffffffffffffffe8,local_10);
      in_stack_ffffffffffffffe8->rx = in_stack_ffffffffffffffe8->rx + 1;
      in_stack_ffffffffffffffe8->rxbytes =
           (uint)local_10->length + in_stack_ffffffffffffffe8->rxbytes;
      pcVar5 = csp_iflist_get_by_addr((local_10->id).dst);
      bVar8 = true;
      if (pcVar5 == (csp_iface_t *)0x0) {
        iVar4 = csp_id_is_broadcast(in_stack_ffffffffffffffb2,
                                    (csp_iface_t *)in_stack_ffffffffffffffa8);
        bVar8 = iVar4 != 0;
      }
      uVar9 = bVar8;
      if ((((csp_conf.dedup == '\x03') || ((bVar8 != false && (csp_conf.dedup == '\x02')))) ||
          ((bVar8 == false && (csp_conf.dedup == '\x01')))) &&
         (_Var3 = csp_dedup_is_duplicate
                            ((csp_packet_t *)
                             CONCAT17(in_stack_ffffffffffffffbf,
                                      CONCAT16(in_stack_ffffffffffffffbe,
                                               CONCAT24(in_stack_ffffffffffffffbc,
                                                        CONCAT22(in_stack_ffffffffffffffba,
                                                                 CONCAT11(in_stack_ffffffffffffffb9,
                                                                          in_stack_ffffffffffffffb8)
                                                                ))))), _Var3)) {
        in_stack_ffffffffffffffe8->drop = in_stack_ffffffffffffffe8->drop + 1;
        csp_buffer_free((void *)CONCAT17(in_stack_ffffffffffffffb7,
                                         CONCAT16(uVar9,CONCAT24(in_stack_ffffffffffffffb4,
                                                                 CONCAT22(in_stack_ffffffffffffffb2,
                                                                          in_stack_ffffffffffffffb0)
                                                                ))));
        iVar4 = 0;
      }
      else {
        csp_promisc_add((csp_packet_t *)
                        CONCAT17(in_stack_ffffffffffffffb7,
                                 CONCAT16(uVar9,CONCAT24(in_stack_ffffffffffffffb4,
                                                         CONCAT22(in_stack_ffffffffffffffb2,
                                                                  in_stack_ffffffffffffffb0)))));
        if (bVar8 == false) {
          csp_send_direct((csp_id_t_conflict *)local_10,in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd0);
          iVar4 = 0;
        }
        else {
          iVar4 = csp_route_check_options(in_stack_ffffffffffffffe8,local_10);
          if (iVar4 == 0) {
            idin = (csp_id_t_conflict)csp_port_get_callback((uint)(local_10->id).dport);
            if (idin == (csp_id_t_conflict)0x0) {
              pcVar6 = csp_port_get_socket((uint)(local_10->id).dport);
              if ((pcVar6 == (csp_socket_t *)0x0) || ((pcVar6->opts & 0x100) == 0)) {
                pcVar7 = csp_conn_find_existing((csp_id_t_conflict *)&local_10->id);
                if (pcVar7 == (csp_conn_t *)0x0) {
                  if (pcVar6 == (csp_socket_t *)0x0) {
                    csp_buffer_free((void *)CONCAT17(in_stack_ffffffffffffffb7,
                                                     CONCAT16(uVar9,CONCAT24(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT22(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0)))));
                    return 0;
                  }
                  iVar4 = csp_route_security_check
                                    (CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0),
                                     (csp_iface_t *)in_stack_ffffffffffffffa8,
                                     (csp_packet_t *)0x10a921);
                  if (iVar4 != 0) {
                    csp_buffer_free((void *)CONCAT17(in_stack_ffffffffffffffb7,
                                                     CONCAT16(uVar9,CONCAT24(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT22(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0)))));
                    return 0;
                  }
                  uVar1 = (local_10->id).pri;
                  uVar2 = (local_10->id).flags;
                  idout_00.flags = uVar2;
                  idout_00.pri = uVar1;
                  idout_00.src = (local_10->id).dst;
                  idout_00.dst = (local_10->id).src;
                  idout_00.dport = (local_10->id).sport;
                  idout_00.sport = (local_10->id).dport;
                  pcVar7 = csp_conn_new(idin,idout_00,
                                        CONCAT13(in_stack_ffffffffffffffb7,
                                                 CONCAT12(uVar9,in_stack_ffffffffffffffb4)));
                  if (pcVar7 == (csp_conn_t *)0x0) {
                    csp_dbg_conn_out = csp_dbg_conn_out + '\x01';
                    csp_buffer_free((void *)CONCAT17(in_stack_ffffffffffffffb7,
                                                     CONCAT16(uVar9,CONCAT24(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT22(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0)))));
                    return 0;
                  }
                  pcVar7->dest_socket = pcVar6;
                  pcVar7->opts = pcVar6->opts;
                }
                else {
                  iVar4 = csp_route_security_check
                                    (CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0),
                                     (csp_iface_t *)in_stack_ffffffffffffffa8,
                                     (csp_packet_t *)0x10aa1d);
                  if (iVar4 != 0) {
                    csp_buffer_free((void *)CONCAT17(in_stack_ffffffffffffffb7,
                                                     CONCAT16(uVar9,CONCAT24(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT22(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0)))));
                    return 0;
                  }
                }
                if (((local_10->id).flags & 2) == 0) {
                  iVar4 = csp_conn_enqueue_packet
                                    (in_stack_ffffffffffffffa8,(csp_packet_t *)0x10aa8e);
                  if (iVar4 == 0) {
                    if (pcVar7->dest_socket != (csp_socket_t *)0x0) {
                      iVar4 = csp_queue_enqueue((csp_queue_handle_t)
                                                CONCAT17(in_stack_ffffffffffffffb7,
                                                         CONCAT16(uVar9,CONCAT24(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT22(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0)))),
                                                in_stack_ffffffffffffffa8,0);
                      if (iVar4 != 0) {
                        csp_dbg_conn_ovf = csp_dbg_conn_ovf + '\x01';
                        csp_close((csp_conn_t *)0x10ab0a);
                        return 0;
                      }
                      pcVar7->dest_socket = (csp_socket_t *)0x0;
                    }
                    iVar4 = 0;
                  }
                  else {
                    csp_dbg_conn_ovf = csp_dbg_conn_ovf + '\x01';
                    csp_buffer_free((void *)CONCAT17(in_stack_ffffffffffffffb7,
                                                     CONCAT16(uVar9,CONCAT24(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT22(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0)))));
                    iVar4 = 0;
                  }
                }
                else {
                  _Var3 = csp_rdp_new_packet(unaff_retaddr,
                                             (csp_packet_t *)
                                             CONCAT44(in_stack_fffffffffffffffc,
                                                      in_stack_fffffffffffffff8));
                  if (_Var3) {
                    csp_close((csp_conn_t *)0x10aa72);
                  }
                  iVar4 = 0;
                }
              }
              else {
                iVar4 = csp_route_security_check
                                  (CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0),
                                   (csp_iface_t *)in_stack_ffffffffffffffa8,(csp_packet_t *)0x10a85b
                                  );
                if (iVar4 == 0) {
                  iVar4 = csp_queue_enqueue((csp_queue_handle_t)
                                            CONCAT17(in_stack_ffffffffffffffb7,
                                                     CONCAT16(uVar9,CONCAT24(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT22(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0)))),
                                            in_stack_ffffffffffffffa8,0);
                  if (iVar4 == 0) {
                    iVar4 = 0;
                  }
                  else {
                    csp_dbg_conn_ovf = csp_dbg_conn_ovf + '\x01';
                    csp_buffer_free((void *)CONCAT17(in_stack_ffffffffffffffb7,
                                                     CONCAT16(uVar9,CONCAT24(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT22(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0)))));
                    iVar4 = 0;
                  }
                }
                else {
                  csp_buffer_free((void *)CONCAT17(in_stack_ffffffffffffffb7,
                                                   CONCAT16(uVar9,CONCAT24(in_stack_ffffffffffffffb4
                                                                           ,CONCAT22(
                                                  in_stack_ffffffffffffffb2,
                                                  in_stack_ffffffffffffffb0)))));
                  iVar4 = 0;
                }
              }
            }
            else {
              iVar4 = csp_route_security_check
                                (CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0),
                                 (csp_iface_t *)in_stack_ffffffffffffffa8,(csp_packet_t *)0x10a7d4);
              if (iVar4 == 0) {
                (*(code *)idin)(local_10);
                iVar4 = 0;
              }
              else {
                csp_buffer_free((void *)CONCAT17(in_stack_ffffffffffffffb7,
                                                 CONCAT16(uVar9,CONCAT24(in_stack_ffffffffffffffb4,
                                                                         CONCAT22(
                                                  in_stack_ffffffffffffffb2,
                                                  in_stack_ffffffffffffffb0)))));
                iVar4 = 0;
              }
            }
          }
          else {
            csp_buffer_free((void *)CONCAT17(in_stack_ffffffffffffffb7,
                                             CONCAT16(uVar9,CONCAT24(in_stack_ffffffffffffffb4,
                                                                     CONCAT22(
                                                  in_stack_ffffffffffffffb2,
                                                  in_stack_ffffffffffffffb0)))));
            iVar4 = 0;
          }
        }
      }
    }
  }
  else {
    iVar4 = -3;
  }
  return iVar4;
}

Assistant:

int csp_route_work(void) {

	csp_qfifo_t input;
	csp_packet_t * packet;
	csp_conn_t * conn;
	csp_socket_t * socket;

#if (CSP_USE_RDP)
	/* Check connection timeouts (currently only for RDP) */
	csp_conn_check_timeouts();
#endif

	/* Get next packet to route */
	if (csp_qfifo_read(&input) != CSP_ERR_NONE) {
		return CSP_ERR_TIMEDOUT;
	}

	packet = input.packet;
	if (packet == NULL) {
		return CSP_ERR_TIMEDOUT;
	}

	csp_input_hook(input.iface, packet);

	/* Count the message */
	input.iface->rx++;
	input.iface->rxbytes += packet->length;

	/* The packet is to me, if the address matches that of any interface,
	 * or the address matches the broadcast address of the incoming interface */
	int is_to_me = (csp_iflist_get_by_addr(packet->id.dst) != NULL || (csp_id_is_broadcast(packet->id.dst, input.iface)));

	/* Deduplication */
	if ((csp_conf.dedup == CSP_DEDUP_ALL) ||
		((is_to_me) && (csp_conf.dedup == CSP_DEDUP_INCOMING)) ||
		((!is_to_me) && (csp_conf.dedup == CSP_DEDUP_FWD))) {
		if (csp_dedup_is_duplicate(packet)) {
			/* Discard packet */
			input.iface->drop++;
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}
	}

	/* Here there be promiscuous mode */
#if (CSP_USE_PROMISC)
	csp_promisc_add(packet);
#endif

	/* If the message is not to me, route the message to the correct interface */
	if (!is_to_me) {

		/* Otherwise, actually send the message */
		csp_send_direct(&packet->id, packet, input.iface);
		return CSP_ERR_NONE;

	}

	/* Discard packets with unsupported options */
	if (csp_route_check_options(input.iface, packet) != CSP_ERR_NONE) {
		csp_buffer_free(packet);
		return CSP_ERR_NONE;
	}

	/**
	 * Callbacks 
	 */
	csp_callback_t callback = csp_port_get_callback(packet->id.dport);
	if (callback) {

		if (csp_route_security_check(CSP_SO_CRC32REQ, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		callback(packet);
		return CSP_ERR_NONE;
	}

	/**
	 * Sockets 
	 */

	/* The message is to me, search for incoming socket */
	socket = csp_port_get_socket(packet->id.dport);

	/* If the socket is connection-less, deliver now */
	if (socket && (socket->opts & CSP_SO_CONN_LESS)) {

		if (csp_route_security_check(socket->opts, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		if (csp_queue_enqueue(socket->rx_queue, &packet, 0) != CSP_QUEUE_OK) {
			csp_dbg_conn_ovf++;
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}
		
		return CSP_ERR_NONE;
	}

	/* Search for an existing connection */
	conn = csp_conn_find_existing(&packet->id);

	/* If this is an incoming packet on a new connection */
	if (conn == NULL) {

		/* Reject packet if no matching socket is found */
		if (!socket) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		/* Run security check on incoming packet */
		if (csp_route_security_check(socket->opts, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		/* New incoming connection accepted */
		csp_id_t idout;
		idout.pri = packet->id.pri;
		idout.src = packet->id.dst;
		idout.dst = packet->id.src;
		idout.dport = packet->id.sport;
		idout.sport = packet->id.dport;
		idout.flags = packet->id.flags;

		/* Create connection */
		conn = csp_conn_new(packet->id, idout, CONN_SERVER);

		if (!conn) {
			csp_dbg_conn_out++;
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		/* Store the socket queue and options */
		conn->dest_socket = socket;
		conn->opts = socket->opts;

		/* Packet to existing connection */
	} else {

		/* Run security check on incoming packet */
		if (csp_route_security_check(conn->opts, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}
	}

#if (CSP_USE_RDP)
	/* Pass packet to RDP module */
	if (packet->id.flags & CSP_FRDP) {
		bool close_connection = csp_rdp_new_packet(conn, packet);
		if (close_connection) {
			csp_close(conn);
		}
		return CSP_ERR_NONE;
	}
#endif

	/* Otherwise, enqueue directly */
	if (csp_conn_enqueue_packet(conn, packet) != CSP_ERR_NONE) {
		csp_dbg_conn_ovf++;
		csp_buffer_free(packet);
		return CSP_ERR_NONE;
	}

	/* Try to queue up the new connection pointer */
	if (conn->dest_socket != NULL) {
		if (csp_queue_enqueue(conn->dest_socket->rx_queue, &conn, 0) != CSP_QUEUE_OK) {
			csp_dbg_conn_ovf++;
			csp_close(conn);
			return CSP_ERR_NONE;
		}

		/* Ensure that this connection will not be posted to this socket again */
		conn->dest_socket = NULL;
	}

	return CSP_ERR_NONE;
}